

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.c
# Opt level: O0

int stlfts_(double *x,int *n,int *np,double *trend,double *work)

{
  int local_38;
  int local_34;
  int c__3;
  int i__1;
  double *work_local;
  double *trend_local;
  int *np_local;
  int *n_local;
  double *x_local;
  
  local_38 = 3;
  _c__3 = work + -1;
  work_local = trend + -1;
  n_local = (int *)(x + -1);
  trend_local = (double *)np;
  np_local = n;
  stlma_(x,n,np,trend);
  local_34 = (*np_local - *(int *)trend_local) + 1;
  stlma_(work_local + 1,&local_34,(int *)trend_local,_c__3 + 1);
  local_34 = *np_local + *(int *)trend_local * -2 + 2;
  stlma_(_c__3 + 1,&local_34,&local_38,work_local + 1);
  return 0;
}

Assistant:

int stlfts_(double *x, int *n, int *np, double *trend, double *work)
{
    /* System generated locals */
    int i__1;
	int c__3 = 3;

    /* Parameter adjustments */
    --work;
    --trend;
    --x;

    /* Function Body */
    stlma_(&x[1], n, np, &trend[1]);
    i__1 = *n - *np + 1;
    stlma_(&trend[1], &i__1, np, &work[1]);
    i__1 = *n - (*np << 1) + 2;
    stlma_(&work[1], &i__1, &c__3, &trend[1]);
    return 0;
}